

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandFraigDress(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nConflictLimit;
  Io_FileType_t FileType;
  Abc_Ntk_t *pNtk1;
  char **ppcVar2;
  Abc_Ntk_t *pNtk2;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  
  pNtk1 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nConflictLimit = 1000;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Cvh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pNtk1 == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Empty network.\n";
      }
      else if (pNtk1->ntkType == ABC_NTK_STRASH) {
        pcVar3 = "This command works only for logic networks.\n";
      }
      else {
        if (globalUtilOptind + 1 != argc && globalUtilOptind != argc) break;
        if ((globalUtilOptind != argc) || (pNtk1->pSpec != (char *)0x0)) {
          ppcVar2 = argv + globalUtilOptind;
          if (globalUtilOptind + 1 != argc) {
            ppcVar2 = &pNtk1->pSpec;
          }
          pcVar3 = *ppcVar2;
          FileType = Io_ReadFileType(pcVar3);
          pNtk2 = Io_Read(pcVar3,FileType,1,0);
          Abc_NtkDress2(pNtk1,pNtk2,nConflictLimit,fVerbose);
          Abc_NtkDelete(pNtk2);
          return 0;
        }
        pcVar3 = "The current network has no spec.\n";
      }
      iVar4 = -1;
      goto LAB_0020b567;
    }
    if (iVar1 != 0x43) break;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    nConflictLimit = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
  } while (-1 < (int)nConflictLimit);
  Abc_Print(-2,"usage: dress [-C num] [-vh] <file>\n");
  Abc_Print(-2,"\t         transfers internal node names from file to the current network\n");
  Abc_Print(-2,"\t<file> : network with names (if not given, the current network spec is used)\n");
  Abc_Print(-2,"\t-C num : the maximum number of conflicts at each node [default = %d]\n",
            (ulong)nConflictLimit);
  pcVar3 = "yes";
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar3);
  pcVar3 = "\t-h     : print the command usage\n";
  iVar4 = -2;
LAB_0020b567:
  Abc_Print(iVar4,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandFraigDress( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDress( Abc_Ntk_t * pNtk, char * pFileName, int fVerbose );
    extern void Abc_NtkDress2( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConflictLimit, int fVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc), * pNtk2;
    char * pFileName;
    int c;
    int nConfs;
    int fVerbose;
    // set defaults
    nConfs   = 1000;
    fVerbose =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfs < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for logic networks.\n" );
        return 1;
    }
    if ( argc != globalUtilOptind && argc != globalUtilOptind + 1 )
        goto usage;
    if ( argc == globalUtilOptind && Abc_NtkSpec(pNtk) == NULL )
    {
        Abc_Print( -1, "The current network has no spec.\n" );
        return 1;
    }
    // get the input file name
    pFileName = (argc == globalUtilOptind + 1) ? argv[globalUtilOptind] : Abc_NtkSpec(pNtk);
    // modify the current network
//    Abc_NtkDress( pNtk, pFileName, fVerbose );
    pNtk2 = Io_Read( pFileName, Io_ReadFileType(pFileName), 1, 0 );
    Abc_NtkDress2( pNtk, pNtk2, nConfs, fVerbose );
    Abc_NtkDelete( pNtk2 );
    return 0;

usage:
    Abc_Print( -2, "usage: dress [-C num] [-vh] <file>\n" );
    Abc_Print( -2, "\t         transfers internal node names from file to the current network\n" );
    Abc_Print( -2, "\t<file> : network with names (if not given, the current network spec is used)\n" );
    Abc_Print( -2, "\t-C num : the maximum number of conflicts at each node [default = %d]\n", nConfs );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}